

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegExp.cc
# Opt level: O3

void __thiscall flow::util::RegExp::RegExp(RegExp *this,string *pattern)

{
  pointer pcVar1;
  
  (this->pattern_)._M_dataplus._M_p = (pointer)&(this->pattern_).field_2;
  pcVar1 = (pattern->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + pattern->_M_string_length);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&this->re_,pattern,0x10);
  return;
}

Assistant:

RegExp::RegExp(const std::string& pattern)
    : pattern_(pattern), re_(pattern) {
}